

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopUtil.c
# Opt level: O0

void Hop_ObjPrintEqn(FILE *pFile,Hop_Obj_t *pObj,Vec_Vec_t *vLevels,int Level)

{
  int c;
  int iVar1;
  Hop_Obj_t *pHVar2;
  Vec_Ptr_t *vSuper_00;
  char *pcVar3;
  int local_40;
  int i;
  int fCompl;
  Hop_Obj_t *pFanin;
  Vec_Ptr_t *vSuper;
  int Level_local;
  Vec_Vec_t *vLevels_local;
  Hop_Obj_t *pObj_local;
  FILE *pFile_local;
  
  c = Hop_IsComplement(pObj);
  pHVar2 = Hop_Regular(pObj);
  iVar1 = Hop_ObjIsConst1(pHVar2);
  if (iVar1 == 0) {
    iVar1 = Hop_ObjIsPi(pHVar2);
    if (iVar1 == 0) {
      Vec_VecExpand(vLevels,Level);
      vSuper_00 = Vec_VecEntry(vLevels,Level);
      Hop_ObjCollectMulti(pHVar2,vSuper_00);
      pcVar3 = "(";
      if (Level == 0) {
        pcVar3 = "";
      }
      fprintf((FILE *)pFile,"%s",pcVar3);
      for (local_40 = 0; iVar1 = Vec_PtrSize(vSuper_00), local_40 < iVar1; local_40 = local_40 + 1)
      {
        pHVar2 = (Hop_Obj_t *)Vec_PtrEntry(vSuper_00,local_40);
        pHVar2 = Hop_NotCond(pHVar2,c);
        Hop_ObjPrintEqn(pFile,pHVar2,vLevels,Level + 1);
        iVar1 = Vec_PtrSize(vSuper_00);
        if (local_40 < iVar1 + -1) {
          pcVar3 = "*";
          if (c != 0) {
            pcVar3 = "+";
          }
          fprintf((FILE *)pFile," %s ",pcVar3);
        }
      }
      pcVar3 = ")";
      if (Level == 0) {
        pcVar3 = "";
      }
      fprintf((FILE *)pFile,"%s",pcVar3);
    }
    else {
      pcVar3 = "";
      if (c != 0) {
        pcVar3 = "!";
      }
      fprintf((FILE *)pFile,"%s%s",pcVar3,(pHVar2->field_0).pData);
    }
  }
  else {
    fprintf((FILE *)pFile,"%d",(ulong)((c != 0 ^ 0xffU) & 1));
  }
  return;
}

Assistant:

void Hop_ObjPrintEqn( FILE * pFile, Hop_Obj_t * pObj, Vec_Vec_t * vLevels, int Level )
{
    Vec_Ptr_t * vSuper;
    Hop_Obj_t * pFanin;
    int fCompl, i;
    // store the complemented attribute
    fCompl = Hop_IsComplement(pObj);
    pObj = Hop_Regular(pObj);
    // constant case
    if ( Hop_ObjIsConst1(pObj) )
    {
        fprintf( pFile, "%d", !fCompl );
        return;
    }
    // PI case
    if ( Hop_ObjIsPi(pObj) )
    {
        fprintf( pFile, "%s%s", fCompl? "!" : "", (char*)pObj->pData );
        return;
    }
    // AND case
    Vec_VecExpand( vLevels, Level );
    vSuper = Vec_VecEntry(vLevels, Level);
    Hop_ObjCollectMulti( pObj, vSuper );
    fprintf( pFile, "%s", (Level==0? "" : "(") );
    Vec_PtrForEachEntry( Hop_Obj_t *, vSuper, pFanin, i )
    {
        Hop_ObjPrintEqn( pFile, Hop_NotCond(pFanin, fCompl), vLevels, Level+1 );
        if ( i < Vec_PtrSize(vSuper) - 1 )
            fprintf( pFile, " %s ", fCompl? "+" : "*" );
    }
    fprintf( pFile, "%s", (Level==0? "" : ")") );
    return;
}